

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::CopyIntPtIndicesFrom
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,
          TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *copy)

{
  long newsize;
  long *plVar1;
  long *plVar2;
  TPZMaterial *pTVar3;
  long lVar4;
  
  pTVar3 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar3 != (TPZMaterial *)0x0) {
    newsize = (copy->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements;
    TPZManVector<long,_128>::Resize(&(this->fIntPtIndices).super_TPZManVector<long,_128>,newsize);
    if (0 < newsize) {
      plVar1 = (copy->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
      plVar2 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
      lVar4 = 0;
      do {
        plVar2[lVar4] = plVar1[lVar4];
        lVar4 = lVar4 + 1;
      } while (newsize != lVar4);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> &) [TBASE = TPZCompElH1<pzshape::TPZShapeQuad>]"
             ,0x9d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
  return;
}

Assistant:

void TPZCompElWithMem<TBASE>::CopyIntPtIndicesFrom(const TPZCompElWithMem<TBASE> & copy)
{
    
    TPZMaterial * material = TBASE::Material();
    if(!material){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    int64_t i, n = copy.fIntPtIndices.NElements();
    fIntPtIndices.Resize(n);
    
    for(i = 0; i < n; i++)
    {
        fIntPtIndices[i] = copy.fIntPtIndices[i];
    }
}